

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_helpers.hpp
# Opt level: O0

string_t duckdb::DecimalToString::Format<short>
                   (short value,uint8_t width,uint8_t scale,Vector *vector)

{
  int in;
  uint uVar1;
  uint uVar2;
  char *dst;
  Vector *in_RCX;
  byte in_DL;
  byte in_SIL;
  int len;
  string_t result;
  idx_t in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  anon_union_16_2_67f50693_for_value local_10;
  
  in = DecimalLength<short>
                 ((short)((ulong)in_stack_ffffffffffffffb0 >> 0x10),
                  (uint8_t)((ulong)in_stack_ffffffffffffffb0 >> 8),
                  (uint8_t)in_stack_ffffffffffffffb0);
  NumericCast<unsigned_long,int,void>(0);
  local_10.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       StringVector::EmptyString(in_RCX,in_stack_ffffffffffffffa8);
  uVar1 = (uint)in_SIL;
  uVar2 = (uint)in_DL;
  uVar3 = (undefined4)((ulong)&local_10 >> 0x20);
  dst = string_t::GetDataWriteable((string_t *)in_RCX);
  UnsafeNumericCast<unsigned_long,int,void>(in);
  FormatDecimal<short>
            ((short)((uint)uVar3 >> 0x10),(uint8_t)((uint)uVar3 >> 8),(uint8_t)uVar3,dst,
             CONCAT44(uVar2,uVar1));
  string_t::Finalize((string_t *)CONCAT44(uVar2,uVar1));
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_10.pointer;
}

Assistant:

static string_t Format(SIGNED value, uint8_t width, uint8_t scale, Vector &vector) {
		int len = DecimalLength<SIGNED>(value, width, scale);
		string_t result = StringVector::EmptyString(vector, NumericCast<size_t>(len));
		FormatDecimal<SIGNED>(value, width, scale, result.GetDataWriteable(), UnsafeNumericCast<idx_t>(len));
		result.Finalize();
		return result;
	}